

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

RTPTransmissionInfo * __thiscall
jrtplib::RTPUDPv4Transmitter::GetTransmissionInfo(RTPUDPv4Transmitter *this)

{
  RTPMemoryManager *pRVar1;
  _List_node_base *p_Var2;
  RTPUDPv4TransmissionInfo *this_00;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPUDPv4TransmissionInfo *)operator_new(0x38);
    }
    else {
      this_00 = (RTPUDPv4TransmissionInfo *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x38,0x1c);
    }
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&local_40,&this->localIPs)
    ;
    RTPUDPv4TransmissionInfo::RTPUDPv4TransmissionInfo
              (this_00,&local_40,this->rtpsock,this->rtcpsock,this->m_rtpPort,this->m_rtcpPort);
    while (local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next != (_List_node_base *)&local_40) {
      p_Var2 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                &(local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      ._M_node.super__List_node_base._M_next,0x18);
      local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var2;
    }
  }
  else {
    this_00 = (RTPUDPv4TransmissionInfo *)0x0;
  }
  return &this_00->super_RTPTransmissionInfo;
}

Assistant:

RTPTransmissionInfo *RTPUDPv4Transmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPUDPv4TransmissionInfo(localIPs,rtpsock,rtcpsock,m_rtpPort,m_rtcpPort);
	MAINMUTEX_UNLOCK
	return tinf;
}